

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

void vkt::ubo::anon_unknown_0::generateDeclaration
               (ostringstream *src,int blockNdx,UniformBlock *block,UniformLayout *layout,
               bool shuffleUniformMembers)

{
  deUint32 flagsMask;
  LayoutFlagsFmt LVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *poVar4;
  Uniform **__args;
  VarType *pVVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
  it;
  LayoutFlagsFmt LVar9;
  Uniform *name_00;
  Traverser<const_vkt::ubo::Uniform> uniforms;
  ostringstream name;
  vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_> local_1f8;
  Uniform **ppUStack_1e0;
  int local_1d4;
  UniformLayout *local_1d0;
  string local_1c8;
  vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_> local_1a8 [4];
  ios_base local_138 [264];
  
  local_1d0 = layout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)src,"layout(set = 0, binding = ",0x1a);
  local_1d4 = blockNdx;
  std::ostream::operator<<(src,blockNdx);
  if ((block->m_flags & 0x1f8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,", ",2);
    local_1a8[0].
    super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)(block->m_flags & 0x1f8);
    operator<<((ostream *)src,(LayoutFlagsFmt *)local_1a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)src,(block->m_blockName)._M_dataplus._M_p,
             (block->m_blockName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\n{\n",3);
  LVar9 = (LayoutFlagsFmt)
          (block->m_uniforms).
          super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
          super__Vector_impl_data._M_start;
  LVar1 = (LayoutFlagsFmt)
          (block->m_uniforms).
          super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
          super__Vector_impl_data._M_finish;
  local_1f8.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Uniform **)0x0;
  ppUStack_1e0 = (Uniform **)0x0;
  local_1f8.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_start = (Uniform **)0x0;
  local_1f8.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Uniform **)0x0;
  if (LVar9 != LVar1) {
    do {
      local_1a8[0].
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)LVar9;
      std::vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>>::
      emplace_back<vkt::ubo::Uniform_const*>
                ((vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>> *)
                 &local_1f8,(Uniform **)local_1a8);
      LVar9 = (LayoutFlagsFmt)((long)LVar9 + 0x40);
    } while (LVar9 != LVar1);
  }
  if (shuffleUniformMembers) {
    std::vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>::vector
              (local_1a8,&local_1f8);
    uVar8 = (ulong)((long)local_1a8[0].
                          super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8[0].
                         super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    if (local_1f8.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_1f8.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_1f8.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_1f8.
           super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((int)uVar8 != 0) {
      iVar6 = -1;
      do {
        uVar7 = (uint)uVar8;
        iVar6 = iVar6 + uVar7;
        __args = (Uniform **)
                 ((long)iVar6 * 8 +
                 (long)local_1a8[0].
                       super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        if (local_1f8.
            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1f8.
            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>>::
          _M_realloc_insert<vkt::ubo::Uniform_const*const&>
                    ((vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>> *)
                     &local_1f8,
                     (iterator)
                     local_1f8.
                     super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_1f8.
           super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = *__args;
          local_1f8.
          super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1f8.
               super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = ~uVar7;
        if (0 < (int)uVar7) {
          uVar3 = 1 - uVar7;
        }
        uVar8 = (ulong)uVar3;
      } while (uVar3 != 0);
    }
    if ((LayoutFlagsFmt)
        local_1a8[0].
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (LayoutFlagsFmt)0x0) {
      operator_delete(local_1a8[0].
                      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8[0].
                            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8[0].
                            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ppUStack_1e0 = local_1f8.
                 super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_00690c8b:
  if (ppUStack_1e0 ==
      local_1f8.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    name_00 = (Uniform *)0x0;
  }
  else {
    name_00 = *ppUStack_1e0;
    ppUStack_1e0 = ppUStack_1e0 + 1;
  }
  if (name_00 != (Uniform *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\t",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if ((block->m_instanceName)._M_string_length != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(block->m_blockName)._M_dataplus._M_p,
                          (block->m_blockName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(name_00->m_name)._M_dataplus._M_p,
               (name_00->m_name)._M_string_length);
    pVVar5 = &name_00->m_type;
LAB_00690d13:
    if (pVVar5->m_type == TYPE_ARRAY) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[0]",3);
      pVVar5 = (pVVar5->m_data).array.elementType;
    }
    else if (pVVar5->m_type == TYPE_BASIC) goto LAB_00690d66;
    if (pVVar5->m_type == TYPE_STRUCT) {
      pSVar2 = (((pVVar5->m_data).structPtr)->m_members).
               super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pSVar2->m_name)._M_dataplus._M_p,
                 (pSVar2->m_name)._M_string_length);
      pVVar5 = &pSVar2->m_type;
    }
    goto LAB_00690d13;
  }
  goto LAB_00690e60;
LAB_00690d66:
  std::__cxx11::stringbuf::str();
  iVar6 = UniformLayout::getUniformLayoutIndex(local_1d0,local_1d4,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  flagsMask = (local_1d0->uniforms).
              super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar6].offset;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((name_00->m_flags & 0x1f8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"layout(",7);
    local_1a8[0].
    super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)(name_00->m_flags & 0x1f8);
    operator<<((ostream *)src,(LayoutFlagsFmt *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,") ",2);
  }
  generateDeclaration(src,&name_00->m_type,&name_00->m_name,name_00->m_flags & 0x1800,0xffffffff,
                      flagsMask,(deUint32)block);
  if (name_00 == (Uniform *)0x0) {
LAB_00690e60:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"}",1);
    if ((block->m_instanceName)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)src,(block->m_instanceName)._M_dataplus._M_p,
                 (block->m_instanceName)._M_string_length);
      if (0 < block->m_arraySize) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"[",1);
        poVar4 = (ostream *)std::ostream::operator<<(src,block->m_arraySize);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,";\n",2);
    if (local_1f8.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Uniform **)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  goto LAB_00690c8b;
}

Assistant:

void generateDeclaration (std::ostringstream& src, int blockNdx, const UniformBlock& block, const UniformLayout& layout, bool shuffleUniformMembers)
{
	src << "layout(set = 0, binding = " << blockNdx;
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << ", " << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK);
	src << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	Traverser<const Uniform> uniforms(block.begin(), block.end(), shuffleUniformMembers);

	while (const Uniform* pUniform = uniforms.next())
	{
		src << Indent(1);
		generateDeclaration(src, *pUniform, 1 /* indent level */, getBlockMemberOffset(blockNdx, block, *pUniform, layout));
	}

	src << "}";

	if (block.hasInstanceName())
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}